

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O2

void Cec_ManSeqDeriveInfoFromCex(Vec_Ptr_t *vInfo,Gia_Man_t *pAig,Abc_Cex_t *pCex)

{
  ulong uVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  char *__assertion;
  int i;
  ulong uVar8;
  
  if (pCex->nBits == (pCex->iFrame + 1) * pCex->nPis + pCex->nRegs) {
    if ((pCex->nBits - pCex->nRegs) + pAig->nRegs <= vInfo->nSize) {
      uVar2 = Vec_PtrReadWordsSimInfo(vInfo);
      uVar6 = 0;
      uVar8 = (ulong)(uint)pCex->nRegs;
      if (pCex->nRegs < 1) {
        uVar8 = uVar6;
      }
      do {
        uVar5 = (uint)uVar6;
        if ((uint)uVar8 == uVar5) goto LAB_00524405;
        uVar1 = uVar6 >> 5;
        uVar6 = (ulong)(uVar5 + 1);
      } while (((uint)(&pCex[1].iPo)[uVar1] >> (uVar5 & 0x1f) & 1) == 0);
      Abc_Print(0,
                "The CEX has flop values different from 0, but they are currently not used by \"resim\".\n"
               );
LAB_00524405:
      uVar8 = (ulong)uVar2;
      i = 0;
      if ((int)uVar2 < 1) {
        uVar8 = 0;
        i = 0;
      }
      for (; i < pAig->nRegs; i = i + 1) {
        pvVar3 = Vec_PtrEntry(vInfo,i);
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          *(undefined4 *)((long)pvVar3 + uVar6 * 4) = 0;
        }
      }
      for (iVar7 = pCex->nRegs; iVar7 < pCex->nBits; iVar7 = iVar7 + 1) {
        piVar4 = (int *)Vec_PtrEntry(vInfo,i);
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          uVar2 = Gia_ManRandom(0);
          piVar4[uVar6] = uVar2;
        }
        i = i + 1;
        *piVar4 = *piVar4 * 4 + ((uint)(&pCex[1].iPo)[iVar7 >> 5] >> ((byte)iVar7 & 0x1f) & 1) * 2;
      }
      for (; i < vInfo->nSize; i = i + 1) {
        pvVar3 = Vec_PtrEntry(vInfo,i);
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          uVar2 = Gia_ManRandom(0);
          *(uint *)((long)pvVar3 + uVar6 * 4) = uVar2;
        }
      }
      return;
    }
    __assertion = "pCex->nBits - pCex->nRegs + Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo)";
    uVar2 = 0x32;
  }
  else {
    __assertion = "pCex->nBits == pCex->nRegs + pCex->nPis * (pCex->iFrame + 1)";
    uVar2 = 0x31;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSeq.c"
                ,uVar2,"void Cec_ManSeqDeriveInfoFromCex(Vec_Ptr_t *, Gia_Man_t *, Abc_Cex_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Sets register values from the counter-example.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cec_ManSeqDeriveInfoFromCex( Vec_Ptr_t * vInfo, Gia_Man_t * pAig, Abc_Cex_t * pCex )
{
    unsigned * pInfo;
    int k, i, w, nWords;
    assert( pCex->nBits == pCex->nRegs + pCex->nPis * (pCex->iFrame + 1) );
    assert( pCex->nBits - pCex->nRegs + Gia_ManRegNum(pAig) <= Vec_PtrSize(vInfo) );
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
/*
    // user register values
    assert( pCex->nRegs == Gia_ManRegNum(pAig) );
    for ( k = 0; k < pCex->nRegs; k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Abc_InfoHasBit( pCex->pData, k )? ~0 : 0;
    }
*/
    // print warning about register values
    for ( k = 0; k < pCex->nRegs; k++ )
        if ( Abc_InfoHasBit( pCex->pData, k ) )
            break;
    if ( k < pCex->nRegs )
        Abc_Print( 0, "The CEX has flop values different from 0, but they are currently not used by \"resim\".\n" );

    // assign zero register values
    for ( k = 0; k < Gia_ManRegNum(pAig); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = 0;
    }
    for ( i = pCex->nRegs; i < pCex->nBits; i++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k++ );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom(0);
        // set simulation pattern and make sure it is second (first will be erased during simulation)
        pInfo[0] = (pInfo[0] << 1) | Abc_InfoHasBit( pCex->pData, i ); 
        pInfo[0] <<= 1;
    }
    for ( ; k < Vec_PtrSize(vInfo); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom(0);
    }
}